

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O0

uint64 crnlib::pack_etc1s_block
                 (etc1_block *dst_block,color_quad_u8 *pSrc_pixels,crn_etc1_pack_params *pack_params
                 )

{
  int iVar1;
  long local_228;
  uint local_21c;
  uint32 s;
  uint32 w;
  uint32 h;
  uint32 t;
  uint32 i;
  uint32 selector;
  int refine_high [8];
  int refine_medium [4];
  int scan [9];
  undefined1 local_1a8 [8];
  results results;
  undefined1 local_170 [8];
  params params;
  etc1_optimizer optimizer;
  uint8 selectors [16];
  crn_etc1_pack_params *pack_params_local;
  color_quad_u8 *pSrc_pixels_local;
  etc1_block *dst_block_local;
  
  etc1_optimizer::etc1_optimizer((etc1_optimizer *)&params.m_constrain_against_base_color5);
  etc1_optimizer::params::params((params *)local_170);
  params.super_crn_etc1_pack_params.m_quality = 0x10;
  params.m_pSrc_pixels._0_1_ = 0;
  params.m_scan_delta_size._0_1_ = 0;
  params._8_8_ = pSrc_pixels;
  etc1_optimizer::results::results((results *)local_1a8);
  results._16_8_ = &optimizer.m_temp_selectors.m_size;
  results.m_block_color_unscaled.field_0 =
       (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
       (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0)
       0x10;
  etc1_optimizer::init
            ((etc1_optimizer *)&params.m_constrain_against_base_color5,(EVP_PKEY_CTX *)local_170);
  memcpy(refine_medium + 2,&DAT_002301f0,0x24);
  if (pack_params->m_quality == cCRNETCQualitySlow) {
    local_228 = 9;
  }
  else {
    iVar1 = 1;
    if (pack_params->m_quality == cCRNETCQualityMedium) {
      iVar1 = 3;
    }
    local_228 = (long)iVar1;
  }
  params.m_pScan_deltas._0_4_ = (uint)local_228;
  params._24_8_ = (long)refine_medium + (9U - local_228 & 0xfffffffffffffffe) * 2 + 8;
  etc1_optimizer::compute((etc1_optimizer *)&params.m_constrain_against_base_color5);
  if ((local_170._0_4_ != cCRNETCQualityFast) && (6000 < (ulong)local_1a8)) {
    refine_high[6] = -3;
    refine_high[7] = -2;
    refine_medium[0] = 2;
    refine_medium[1] = 3;
    _i = 0xfffffff9fffffff8;
    refine_high[0] = -6;
    refine_high[1] = -5;
    refine_high[2] = 5;
    refine_high[3] = 6;
    refine_high[4] = 7;
    refine_high[5] = 8;
    if (local_170._0_4_ == cCRNETCQualityMedium) {
      params.m_pScan_deltas._0_4_ = 4;
      params._24_8_ = refine_high + 6;
    }
    else {
      params.m_pScan_deltas._0_4_ = 2;
      if (12000 < (ulong)local_1a8) {
        params.m_pScan_deltas._0_4_ = 8;
      }
      params._24_8_ = &i + (8 - (ulong)(uint)params.m_pScan_deltas >> 1);
    }
    etc1_optimizer::compute((etc1_optimizer *)&params.m_constrain_against_base_color5);
  }
  t = 0;
  h = 0;
  w = 8;
  for (s = 0; s < 4; s = s + 1) {
    for (local_21c = 0; local_21c < 4; local_21c = local_21c + 1) {
      t = ((uint)(*(byte *)((long)&g_selector_index_to_etc1 + (ulong)selectors[(ulong)h - 8]) >> 1)
          | (*(byte *)((long)&g_selector_index_to_etc1 + (ulong)selectors[(ulong)h - 8]) & 1) <<
            0x10) << ((byte)w & 0xf) | t;
      w = w + 4;
      h = h + 1;
    }
    w = w - 0xf;
  }
  (dst_block->field_0).m_uint64 =
       CONCAT44(t,results.m_error._4_4_ << 0x1d) | (ulong)(uint)(results.m_error._4_4_ << 0x1a) |
       0x2000000 | (ulong)(((uint)results.m_error & 0xffffff) << 3);
  etc1_optimizer::~etc1_optimizer((etc1_optimizer *)&params.m_constrain_against_base_color5);
  return (uint64)local_1a8;
}

Assistant:

uint64 pack_etc1s_block(etc1_block& dst_block, const color_quad_u8* pSrc_pixels, crn_etc1_pack_params& pack_params)
    {
        uint8 selectors[16];
        etc1_optimizer optimizer;
        etc1_optimizer::params params;
        params.m_pSrc_pixels = pSrc_pixels;
        params.m_num_src_pixels = 16;
        params.m_use_color4 = false;
        params.m_constrain_against_base_color5 = false;
        etc1_optimizer::results results;
        results.m_pSelectors = selectors;
        results.m_n = 16;
        optimizer.init(params, results);

        const int scan[] = { -4, -3, -2, -1, 0, 1, 2, 3, 4 };
        params.m_scan_delta_size = pack_params.m_quality == cCRNETCQualitySlow ? CRNLIB_ARRAY_SIZE(scan) : pack_params.m_quality == cCRNETCQualityMedium ? 3
                                                                                                                                                         : 1;
        params.m_pScan_deltas = scan + ((CRNLIB_ARRAY_SIZE(scan) - params.m_scan_delta_size) >> 1);
        optimizer.compute();

        if (params.m_quality >= cCRNETCQualityMedium && results.m_error > 6000)
        {
            const int refine_medium[] = { -3, -2, 2, 3 };
            const int refine_high[] = { -8, -7, -6, -5, 5, 6, 7, 8 };
            if (params.m_quality == cCRNETCQualityMedium)
            {
                params.m_scan_delta_size = CRNLIB_ARRAY_SIZE(refine_medium);
                params.m_pScan_deltas = refine_medium;
            }
            else
            {
                params.m_scan_delta_size = results.m_error > 12000 ? CRNLIB_ARRAY_SIZE(refine_high) : 2;
                params.m_pScan_deltas = refine_high + ((CRNLIB_ARRAY_SIZE(refine_high) - params.m_scan_delta_size) >> 1);
            }
            optimizer.compute();
        }

        uint32 selector = 0;
        for (uint32 i = 0, t = 8, h = 0; h < 4; h++, t -= 15)
        {
            for (uint32 w = 0; w < 4; w++, t += 4, i++)
            {
                uint32 s = g_selector_index_to_etc1[selectors[i]];
                selector |= (s >> 1 | (s & 1) << 16) << (t & 15);
            }
        }

        dst_block.m_uint64 = (uint64)selector << 32 | results.m_block_inten_table << 29 | results.m_block_inten_table << 26 | 1 << 25 | (results.m_block_color_unscaled.m_u32 & 0xFFFFFF) << 3;
        return results.m_error;
    }